

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O0

vec3f json2vec3f(Json *o)

{
  float py;
  vec3f vVar1;
  bool bVar2;
  value_t vVar3;
  undefined8 *puVar4;
  size_type sVar5;
  reference pvVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  float fVar7;
  vector<float,_std::allocator<float>_> a;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff98;
  Json *in_stack_ffffffffffffffa0;
  vector<float,_std::allocator<float>_> *this;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffb0;
  vector<float,_std::allocator<float>_> local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_18;
  vec3f local_c;
  
  local_18 = in_RDI;
  bVar2 = is_number(in_stack_ffffffffffffffa0);
  if (bVar2) {
    fVar7 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_float<float,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x18c0b3);
    vec3f::vec3f(&local_c,fVar7);
  }
  else {
    vVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::type(local_18);
    if (vVar3 != array) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "failed convert json to vec3f";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_vector<std::vector<float,_std::allocator<float>_>,_0>(in_stack_ffffffffffffff98);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&local_30);
    if (sVar5 != 3) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "vector size mismatched";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    this = &local_30;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
    fVar7 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,1);
    py = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,2);
    vec3f::vec3f(&local_c,fVar7,py,*pvVar6);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffb0);
  }
  vVar1.z = local_c.z;
  vVar1.x = local_c.x;
  vVar1.y = local_c.y;
  return vVar1;
}

Assistant:

vec3f json2vec3f(const Json& o) {
	if (is_number(o))
		return vec3f(o);
	if (o.type() != Json::value_t::array)
		throw "failed convert json to vec3f";
	std::vector<float> a = o;
	if (a.size()!=3) throw "vector size mismatched";
	return vec3f(a[0], a[1], a[2]);
}